

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall
HighsCutGeneration::preprocessBaseInequality
          (HighsCutGeneration *this,bool *hasUnboundedInts,bool *hasGeneralInts,bool *hasContinuous)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  HighsInt HVar2;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  int iVar8;
  double *in_RDI;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *this_00;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsInt i_6;
  HighsInt i_5;
  HighsInt j;
  HighsInt i_4;
  double cancelSlack;
  HighsInt i_3;
  vector<int,_std::allocator<int>_> cancelNzs;
  HighsInt numCancel;
  HighsInt maxLen;
  HighsInt i_2;
  HighsInt i_1;
  int expshift;
  HighsInt i;
  double maxAbsVal;
  double maxact;
  HighsInt numZeros;
  HighsCDouble *in_stack_fffffffffffffe98;
  HighsCDouble *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffeae;
  value_type vVar11;
  undefined1 in_stack_fffffffffffffeaf;
  HighsLpRelaxation *in_stack_fffffffffffffeb0;
  value_type vVar12;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  double local_118;
  bool local_e1;
  int local_d8;
  int local_d4;
  int local_cc;
  int local_84;
  vector<int,_std::allocator<int>_> local_80;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  byte local_1;
  
  *in_RSI = 0;
  *in_RCX = 0;
  *in_RDX = 0;
  local_2c = 0;
  local_38 = -in_RDI[0x16];
  local_40 = 0.0;
  pdVar9 = in_RDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  for (local_44 = 0; local_44 < *(int *)((long)in_RDI + 0xe4); local_44 = local_44 + 1) {
    std::abs((int)pdVar9);
    pdVar9 = &local_50;
    pdVar3 = std::max<double>(pdVar9,&local_40);
    local_40 = *pdVar3;
  }
  local_54 = 0;
  frexp(local_40,&local_54);
  local_54 = -local_54;
  dVar10 = ldexp(1.0,local_54);
  in_RDI[0x1d] = dVar10;
  HighsCDouble::operator*=
            ((HighsCDouble *)in_stack_fffffffffffffeb0,
             (double)CONCAT17(in_stack_fffffffffffffeaf,
                              CONCAT16(in_stack_fffffffffffffeae,
                                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                      )));
  for (local_58 = 0; local_58 < *(int *)((long)in_RDI + 0xe4); local_58 = local_58 + 1) {
    dVar10 = ldexp(*(double *)((long)in_RDI[0x18] + (long)local_58 * 8),local_54);
    *(double *)((long)in_RDI[0x18] + (long)local_58 * 8) = dVar10;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (size_type)in_stack_fffffffffffffeb8.this);
  for (local_5c = 0; local_5c != *(int *)((long)in_RDI + 0xe4); local_5c = local_5c + 1) {
    iVar8 = SUB84(*in_RDI,0);
    bVar1 = HighsLpRelaxation::isColIntegral
                      (in_stack_fffffffffffffeb0,
                       CONCAT13(in_stack_fffffffffffffeaf,
                                CONCAT12(in_stack_fffffffffffffeae,in_stack_fffffffffffffeac)));
    local_e1 = false;
    if (bVar1) {
      std::abs(iVar8);
      local_e1 = in_RDI[0x16] * 10.0 < extraout_XMM0_Qa;
    }
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13),
                        (long)local_5c);
    *pvVar4 = local_e1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13),
                        (long)local_5c);
    if (*pvVar4 == '\0') {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c);
      dVar10 = *pvVar5;
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xd);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_5c);
      iVar8 = (int)this_00;
      if (dVar10 < *pvVar5 * 2.0) {
        bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffeb0);
        if (bVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     (size_type)in_stack_fffffffffffffeb8.this);
        }
        iVar8 = (int)in_RDI;
        flipComplementation((HighsCutGeneration *)
                            CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                            (HighsInt)((ulong)in_stack_fffffffffffffeb8.this >> 0x20));
      }
      if (*(double *)((long)in_RDI[0x18] + (long)local_5c * 8) <= 0.0) {
        std::abs(iVar8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c)
        ;
        if (in_RDI[0x16] * 10.0 < extraout_XMM0_Qa_00 * *pvVar5) {
          *local_28 = 1;
          if (0.0 < *(double *)((long)in_RDI[0x18] + (long)local_5c * 8)) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                                (long)local_5c);
            if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
              dVar10 = *(double *)((long)in_RDI[0x18] + (long)local_5c * 8);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                                  (long)local_5c);
              local_38 = dVar10 * *pvVar5 + local_38;
            }
            else {
              local_38 = INFINITY;
            }
          }
          goto LAB_005915af;
        }
      }
      pdVar9 = (double *)((long)in_RDI[0x18] + (long)local_5c * 8);
      if (*pdVar9 <= 0.0 && *pdVar9 != 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c)
        ;
        if ((*pvVar5 == INFINITY) && (!NAN(*pvVar5))) {
          local_1 = 0;
          goto LAB_00591e1f;
        }
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c);
        HighsCDouble::operator-=(in_stack_fffffffffffffea0,(double)in_stack_fffffffffffffe98);
      }
      local_2c = local_2c + 1;
      *(undefined8 *)((long)in_RDI[0x18] + (long)local_5c * 8) = 0;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c);
      if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c)
        ;
        if ((*pvVar5 != 1.0) || (NAN(*pvVar5))) {
          *local_20 = 1;
        }
      }
      else {
        *local_18 = 1;
        *local_20 = 1;
      }
      if (0.0 < *(double *)((long)in_RDI[0x18] + (long)local_5c * 8)) {
        dVar10 = *(double *)((long)in_RDI[0x18] + (long)local_5c * 8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_5c)
        ;
        local_38 = dVar10 * *pvVar5 + local_38;
      }
    }
LAB_005915af:
  }
  HVar2 = HighsLpRelaxation::numCols((HighsLpRelaxation *)0x5915d5);
  local_60 = (int)((double)HVar2 * 0.15 + 100.0);
  if (local_60 < *(int *)((long)in_RDI + 0xe4) - local_2c) {
    local_64 = (*(int *)((long)in_RDI + 0xe4) - local_2c) - local_60;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x591650);
    for (local_84 = 0; local_84 != *(int *)((long)in_RDI + 0xe4); local_84 = local_84 + 1) {
      if (*(double *)((long)in_RDI[0x18] + (long)local_84 * 8) <= 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_84)
        ;
        dVar10 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_84
                           );
        local_118 = dVar10 - *pvVar5;
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_84
                           );
        local_118 = *pvVar5;
      }
      if (local_118 <= in_RDI[0x16]) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)))
                  );
      }
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_80);
    if ((int)sVar6 < local_64) {
      local_1 = 0;
      bVar1 = true;
    }
    else {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_80);
      if (local_64 < (int)sVar6) {
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,
                                     CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)))
                   ,(difference_type)in_stack_fffffffffffffea0);
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
        __last._M_current._7_1_ = in_stack_fffffffffffffec7;
        __last._M_current._0_7_ = in_stack_fffffffffffffec0;
        std::
        partial_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__last,
                   in_stack_fffffffffffffeb8);
      }
      for (local_cc = 0; local_cc < local_64; local_cc = local_cc + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_cc);
        iVar8 = *pvVar7;
        pdVar9 = (double *)((long)in_RDI[0x18] + (long)iVar8 * 8);
        if (0.0 < *pdVar9 || *pdVar9 == 0.0) {
          dVar10 = *(double *)((long)in_RDI[0x18] + (long)iVar8 * 8);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)iVar8);
          local_38 = -dVar10 * *pvVar5 + local_38;
        }
        else {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)iVar8);
          HighsCDouble::operator-=(in_stack_fffffffffffffea0,(double)in_stack_fffffffffffffe98);
        }
        *(undefined8 *)((long)in_RDI[0x18] + (long)iVar8 * 8) = 0;
      }
      local_2c = local_64 + local_2c;
      bVar1 = false;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
    if (bVar1) goto LAB_00591e1f;
  }
  if (local_2c != 0) {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffeb0);
    if (bVar1) {
      local_d4 = *(int *)((long)in_RDI + 0xe4);
      do {
        do {
          local_d4 = local_d4 + -1;
          if (local_d4 < 0) goto LAB_00591df9;
          dVar10 = *(double *)((long)in_RDI[0x18] + (long)local_d4 * 8);
        } while ((dVar10 != 0.0) || (NAN(dVar10)));
        *(int *)((long)in_RDI + 0xe4) = *(int *)((long)in_RDI + 0xe4) + -1;
        *(undefined4 *)((long)in_RDI[0x19] + (long)local_d4 * 4) =
             *(undefined4 *)((long)in_RDI[0x19] + (long)*(int *)((long)in_RDI + 0xe4) * 4);
        *(undefined8 *)((long)in_RDI[0x18] + (long)local_d4 * 8) =
             *(undefined8 *)((long)in_RDI[0x18] + (long)*(int *)((long)in_RDI + 0xe4) * 8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                            (long)*(int *)((long)in_RDI + 0xe4));
        vVar12 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_d4)
        ;
        *pvVar5 = vVar12;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                            (long)*(int *)((long)in_RDI + 0xe4));
        vVar12 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_d4
                           );
        *pvVar5 = vVar12;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13)
                            ,(long)*(int *)((long)in_RDI + 0xe4));
        vVar11 = *pvVar4;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13)
                            ,(long)local_d4);
        *pvVar4 = vVar11;
        local_2c = local_2c + -1;
      } while (local_2c != 0);
    }
    else {
      local_d8 = *(int *)((long)in_RDI + 0xe4);
      do {
        do {
          local_d8 = local_d8 + -1;
          if (local_d8 < 0) goto LAB_00591df9;
          dVar10 = *(double *)((long)in_RDI[0x18] + (long)local_d8 * 8);
        } while ((dVar10 != 0.0) || (NAN(dVar10)));
        *(int *)((long)in_RDI + 0xe4) = *(int *)((long)in_RDI + 0xe4) + -1;
        *(undefined4 *)((long)in_RDI[0x19] + (long)local_d8 * 4) =
             *(undefined4 *)((long)in_RDI[0x19] + (long)*(int *)((long)in_RDI + 0xe4) * 4);
        *(undefined8 *)((long)in_RDI[0x18] + (long)local_d8 * 8) =
             *(undefined8 *)((long)in_RDI[0x18] + (long)*(int *)((long)in_RDI + 0xe4) * 8);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                            (long)*(int *)((long)in_RDI + 0xe4));
        in_stack_fffffffffffffe98 = (HighsCDouble *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_d8)
        ;
        *pvVar5 = (value_type)in_stack_fffffffffffffe98;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                            (long)*(int *)((long)in_RDI + 0xe4));
        in_stack_fffffffffffffea0 = (HighsCDouble *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_d8
                           );
        *pvVar5 = (value_type)in_stack_fffffffffffffea0;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13)
                            ,(long)*(int *)((long)in_RDI + 0xe4));
        vVar11 = *pvVar4;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x13)
                            ,(long)local_d8);
        *pvVar4 = vVar11;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)*(int *)((long)in_RDI + 0xe4));
        vVar11 = *pvVar4;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)local_d8);
        *pvVar4 = vVar11;
        local_2c = local_2c + -1;
      } while (local_2c != 0);
    }
  }
LAB_00591df9:
  local_1 = operator>((double)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
LAB_00591e1f:
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsCutGeneration::preprocessBaseInequality(bool& hasUnboundedInts,
                                                  bool& hasGeneralInts,
                                                  bool& hasContinuous) {
  // preprocess the inequality before cut generation
  // 1. Determine the maximal activity to check for trivial redundancy and
  // tighten coefficients
  // 2. Check for presence of continuous variables and unbounded integers as not
  // all methods for cut generation are applicable in that case
  // 3. Remove coefficients that are below the feasibility tolerance to avoid
  // numerical troubles, use bound constraints to cancel them and
  // reject base inequalities where that is not possible due to unbounded
  // variables
  hasUnboundedInts = false;
  hasContinuous = false;
  hasGeneralInts = false;
  HighsInt numZeros = 0;

  double maxact = -feastol;
  double maxAbsVal = 0;
  for (HighsInt i = 0; i < rowlen; ++i)
    maxAbsVal = std::max(std::abs(vals[i]), maxAbsVal);

  int expshift = 0;
  std::frexp(maxAbsVal, &expshift);
  expshift = -expshift;
  initialScale = std::ldexp(1.0, expshift);
  rhs *= initialScale;
  for (HighsInt i = 0; i < rowlen; ++i) vals[i] = std::ldexp(vals[i], expshift);

  isintegral.resize(rowlen);
  for (HighsInt i = 0; i != rowlen; ++i) {
    // we do not want to have integral variables with small coefficients as this
    // may lead to numerical instabilities during cut generation
    // Therefore we relax integral variables with small coefficients to
    // continuous ones because they still might have a non-negligible
    // contribution e.g. when they come from integral rows with coefficients on
    // the larger side. When we relax them to continuous variables they will be
    // complemented so that their solution value is closest to zero and then
    // will be relaxed if their value is positive or their maximal contribution
    // is below feasibility tolerance.
    isintegral[i] =
        lpRelaxation.isColIntegral(inds[i]) && std::abs(vals[i]) > 10 * feastol;

    if (!isintegral[i]) {
      // complement non-integer variable (cmir separation heuristic complements
      // integral variables in the same way)
      if (upper[i] < 2 * solval[i]) {
        if (complementation.empty()) complementation.resize(rowlen);

        flipComplementation(i);
      }

      // relax positive continuous variables and those with small contributions
      if (vals[i] > 0 || std::abs(vals[i]) * upper[i] <= 10 * feastol) {
        // printf("remove: vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);
        if (vals[i] < 0) {
          if (upper[i] == kHighsInf) return false;
          rhs -= vals[i] * upper[i];
        }

        ++numZeros;
        vals[i] = 0.0;
        continue;
      }

      hasContinuous = true;
      // if (lpRelaxation.isColIntegral(inds[i]))
      //   printf("vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);

      if (vals[i] > 0) {
        if (upper[i] == kHighsInf)
          maxact = kHighsInf;
        else
          maxact += vals[i] * upper[i];
      }
    } else {
      if (upper[i] == kHighsInf) {
        hasUnboundedInts = true;
        hasGeneralInts = true;
      } else if (upper[i] != 1.0) {
        hasGeneralInts = true;
      }

      if (vals[i] > 0) maxact += vals[i] * upper[i];
    }
  }

  HighsInt maxLen = 100 + 0.15 * (lpRelaxation.numCols());

  if (rowlen - numZeros > maxLen) {
    HighsInt numCancel = rowlen - numZeros - maxLen;
    std::vector<HighsInt> cancelNzs;

    for (HighsInt i = 0; i != rowlen; ++i) {
      double cancelSlack = vals[i] > 0 ? solval[i] : upper[i] - solval[i];
      if (cancelSlack <= feastol) cancelNzs.push_back(i);
    }

    if ((HighsInt)cancelNzs.size() < numCancel) return false;
    if ((HighsInt)cancelNzs.size() > numCancel)
      std::partial_sort(cancelNzs.begin(), cancelNzs.begin() + numCancel,
                        cancelNzs.end(), [&](HighsInt a, HighsInt b) {
                          return std::abs(vals[a]) < std::abs(vals[b]);
                        });

    for (HighsInt i = 0; i < numCancel; ++i) {
      HighsInt j = cancelNzs[i];

      if (vals[j] < 0) {
        rhs -= vals[j] * upper[j];
      } else
        maxact -= vals[j] * upper[j];

      vals[j] = 0.0;
    }

    numZeros += numCancel;
  }

  if (numZeros != 0) {
    // remove zeros in place
    if (complementation.empty()) {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          if (--numZeros == 0) break;
        }
      }
    } else {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          complementation[i] = complementation[rowlen];
          if (--numZeros == 0) break;
        }
      }
    }
  }

  return maxact > rhs;
}